

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

bool __thiscall SQLite::Database::tableExists(Database *this,char *apTableName)

{
  long lVar1;
  int32_t iVar2;
  socklen_t in_ECX;
  long in_FS_OFFSET;
  Column local_a0;
  Statement query;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Statement::Statement
            (&query,this,"SELECT count(*) FROM sqlite_master WHERE type=\'table\' AND name=?");
  Statement::bind(&query,1,(sockaddr *)apTableName,in_ECX);
  Statement::executeStep(&query);
  Statement::getColumn(&local_a0,&query,0);
  iVar2 = Column::getInt(&local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Statement::~Statement(&query);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2 == 1;
  }
  __stack_chk_fail();
}

Assistant:

bool Database::tableExists(const char* apTableName) const
{
    Statement query(*this, "SELECT count(*) FROM sqlite_master WHERE type='table' AND name=?");
    query.bind(1, apTableName);
    (void)query.executeStep(); // Cannot return false, as the above query always return a result
    return (1 == query.getColumn(0).getInt());
}